

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall
google::protobuf::UninterpretedOption_NamePart::ByteSizeLong(UninterpretedOption_NamePart *this)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar2 = (size_t)(*(uint *)&this->field_0 & 2);
  if ((*(uint *)&this->field_0 & 1) != 0) {
    sVar1 = internal::WireFormatLite::StringSize
                      ((string *)
                       ((ulong)(this->field_0)._impl_.name_part_.tagged_ptr_.ptr_ &
                       0xfffffffffffffffc));
    sVar2 = sVar2 + sVar1 + 1;
  }
  sVar2 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar2,&(this->field_0)._impl_._cached_size_);
  return sVar2;
}

Assistant:

::size_t UninterpretedOption_NamePart::ByteSizeLong() const {
  const UninterpretedOption_NamePart& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.UninterpretedOption.NamePart)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += static_cast<bool>(0x00000002u & cached_has_bits) * 2;
   {
    // required string name_part = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_name_part());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}